

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O1

int expand_warning(dmr_C *C,expression *expr,int cost)

{
  char *pcVar1;
  int iVar2;
  undefined1 local_48 [8];
  ptr_list_iter argiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(expr->field_5).field_2.string);
  pcVar1 = (char *)ptrlist_iter_next((ptr_list_iter *)local_48);
  while (pcVar1 != (char *)0x0) {
    iVar2 = 5;
    if (*pcVar1 == '\x01') {
      if (*(long *)(pcVar1 + 0x20) == 0) goto LAB_0010763f;
    }
    else {
      if (*pcVar1 != '\x03') goto LAB_0010763f;
      pcVar1 = *(char **)(*(long *)(pcVar1 + 0x20) + 0xb0);
      if ((pcVar1 != (char *)0x0) && (*pcVar1 == '\x02')) {
        dmrC_warning(C,expr->pos,"%*s",(ulong)((**(uint **)(pcVar1 + 0x28) & 0x7fffffff) - 1),
                     *(uint **)(pcVar1 + 0x28) + 1);
      }
    }
    pcVar1 = (char *)ptrlist_iter_next((ptr_list_iter *)local_48);
  }
  iVar2 = 0;
LAB_0010763f:
  if ((iVar2 == 5) || (iVar2 == 0)) {
    *(undefined1 *)expr = 1;
    (expr->field_5).field_0.value = 1;
    (expr->field_5).field_0.taint = 0;
  }
  return 0;
}

Assistant:

static int expand_warning(struct dmr_C *C, struct expression *expr, int cost)
{
	struct expression *arg;
	struct expression_list *arglist = expr->args;
	(void)cost;

	FOR_EACH_PTR (arglist, arg) {
		/*
		 * Constant strings get printed out as a warning. By the
		 * time we get here, the EXPR_STRING has been fully 
		 * evaluated, so by now it's an anonymous symbol with a
		 * string initializer.
		 *
		 * Just for the heck of it, allow any constant string
		 * symbol.
		 */
		if (arg->type == EXPR_SYMBOL) {
			struct symbol *sym = arg->symbol;
			if (sym->initializer && sym->initializer->type == EXPR_STRING) {
				struct string *string = sym->initializer->string;
				dmrC_warning(C, expr->pos, "%*s", string->length-1, string->data);
			}
			continue;
		}

		/*
		 * Any other argument is a conditional. If it's
		 * non-constant, or it is false, we exit and do
		 * not print any warning.
		 */
		if (arg->type != EXPR_VALUE)
			goto out;
		if (!arg->value)
			goto out;
	} END_FOR_EACH_PTR(arg);
out:
	expr->type = EXPR_VALUE;
	expr->value = 1;
	expr->taint = 0;
	return 0;
}